

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall embree::SceneGraph::MultiTransformNode::calculateInDegree(MultiTransformNode *this)

{
  size_type sVar1;
  reference pvVar2;
  long in_RDI;
  size_t i;
  ulong local_30;
  
  *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + 1;
  if (*(long *)(in_RDI + 0x50) == 1) {
    (**(code **)(**(long **)(in_RDI + 0x80) + 0x30))();
    for (local_30 = 0;
        sVar1 = std::
                vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                ::size((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                        *)(in_RDI + 0x68)), local_30 < sVar1; local_30 = local_30 + 1) {
      pvVar2 = std::
               vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
               ::operator[]((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                             *)(in_RDI + 0x68),local_30);
      if (1 < (pvVar2->spaces).size_active) {
        (**(code **)(**(long **)(in_RDI + 0x80) + 0x30))();
      }
    }
  }
  return;
}

Assistant:

void SceneGraph::MultiTransformNode::calculateInDegree()
  {
    indegree++;
    if (indegree == 1) {
      child->calculateInDegree();
      for (size_t i = 0; i < spaces.size(); ++i)
        if (spaces[i].size() > 1) child->calculateInDegree(); // break instance up when motion blur is used
    }
  }